

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O0

MPP_RET reenc_calc_cbr_ratio(void *ctx,EncRcTaskInfo *cfg)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  RK_S32 RVar8;
  int iVar9;
  int iVar10;
  RK_S32 RVar11;
  RK_S32 RVar12;
  double dVar13;
  int qp_c;
  float start_qp;
  float b;
  float a;
  float c;
  float lnb_t;
  RK_U32 tar_bpp;
  RK_S32 mb_h;
  RK_S32 mb_w;
  RK_S32 wl_ratio;
  RK_S32 bps_ratio;
  RK_S32 ins_ratio;
  RK_S32 bit_diff_ratio;
  RK_S32 idx2;
  RK_S32 idx1;
  RK_S32 water_level;
  RK_S32 target_bps;
  RK_S32 target_bit;
  RK_S32 real_bit;
  RK_S32 ins_bps;
  RK_S32 pre_ins_bps;
  RK_S32 stat_time;
  RcCfg *usr_cfg;
  RcModelV2Ctx *p;
  EncRcTaskInfo *cfg_local;
  void *ctx_local;
  
  iVar10 = *(int *)((long)ctx + 0x3c);
  RVar8 = mpp_data_sum_v2(*(MppDataV2 **)((long)ctx + 0x208));
  iVar9 = RVar8 / iVar10;
  RVar8 = mpp_data_get_pre_val_v2(*(MppDataV2 **)((long)ctx + 0x208),-1);
  iVar10 = ((iVar9 * iVar10 - RVar8) + cfg->bit_real) / iVar10;
  uVar1 = cfg->bit_real;
  uVar2 = cfg->bit_target;
  iVar3 = *(int *)((long)ctx + 0x1b8);
  iVar4 = *ctx;
  iVar5 = *(int *)((long)ctx + 4);
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","reenc_calc_cbr_ratio",ctx);
  }
  if ((cfg->bit_real < *(int *)((long)ctx + 0x200)) || (*(int *)((long)ctx + 0xc4) != 1)) {
    if (*(int *)((long)ctx + 0x220) < (int)(uVar1 + *(int *)((long)ctx + 0x224))) {
      idx2 = *(int *)((long)ctx + 0x220) - *(int *)((long)ctx + 0x110);
    }
    else {
      idx2 = (uVar1 + *(int *)((long)ctx + 0x224)) - *(int *)((long)ctx + 0x110);
    }
    if (idx2 < 0) {
      idx2 = 0;
    }
    if ((int)uVar1 < (int)uVar2) {
      bps_ratio = (int)((uVar1 - uVar2) * 0x20) / (int)uVar1;
    }
    else {
      bps_ratio = (int)((uVar1 - uVar2) * 0x20) / (int)uVar2;
    }
    RVar8 = mpp_clip(iVar10 / (iVar3 >> 5),0,0x3f);
    RVar11 = mpp_clip(iVar9 / (iVar3 >> 5),0,0x3f);
    iVar6 = *(int *)((long)ctx + 0x228);
    iVar7 = *(int *)((long)ctx + 0x228);
    if ((iVar9 < iVar10) && (iVar3 != iVar9)) {
      wl_ratio = mpp_clip((tab_lnx[RVar8] - tab_lnx[RVar11]) * 6,-0xc0,0x100);
    }
    else if (cfg->frame_type == INTRA_FRAME) {
      wl_ratio = mpp_clip((tab_lnx[RVar8] - tab_lnx[RVar11]) * 3,-0xc0,0x100);
    }
    else {
      wl_ratio = 0;
    }
    RVar8 = mpp_clip(bps_ratio,-0x80,0x100);
    RVar11 = mpp_clip(((iVar10 - iVar3) * 0x60) / iVar3,-0x20,0x20);
    RVar12 = mpp_clip(((idx2 - iVar6) * 0x20) / iVar7,-0x20,0x20);
    *(RK_S32 *)((long)ctx + 0x230) = RVar8 + wl_ratio + RVar11 + RVar12;
    if ((cfg->frame_type == INTRA_FRAME) && (0 < cfg->madi)) {
      dVar13 = log((double)(uint)((int)uVar2 /
                                 ((int)((long)((long)(iVar4 + 0xf) & 0xfffffffffffffff0U) / 0x10) *
                                 (int)((long)((long)(iVar5 + 0xf) & 0xfffffffffffffff0U) / 0x10))));
      iVar10 = (int)((((float)dVar13 - (float)cfg->madi * 0.0438) - 6.7204) / -0.1435 + 14.0);
      if ((float)(*(int *)((long)ctx + 0x24c) >> 6) < (float)iVar10) {
        *(int *)((long)ctx + 0x230) = iVar10 * 0x40 - *(int *)((long)ctx + 0x24c);
      }
    }
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","cbr target_bit %d real_bit %d reenc next ratio %d",
                 "reenc_calc_cbr_ratio",(ulong)uVar2,(ulong)uVar1,*(undefined4 *)((long)ctx + 0x230)
                );
    }
    if ((rc_debug & 1) != 0) {
      _mpp_log_l(4,"rc_model_v2","leave %p\n","reenc_calc_cbr_ratio",ctx);
    }
    ctx_local._4_4_ = MPP_OK;
  }
  else {
    ctx_local._4_4_ = reenc_calc_super_frm_ratio(ctx,cfg);
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET reenc_calc_cbr_ratio(void *ctx, EncRcTaskInfo *cfg)
{
    RcModelV2Ctx *p = (RcModelV2Ctx *)ctx;
    RcCfg *usr_cfg = &p->usr_cfg;
    RK_S32 stat_time = usr_cfg->stats_time;
    RK_S32 pre_ins_bps = mpp_data_sum_v2(p->stat_bits) / stat_time;
    RK_S32 ins_bps = (pre_ins_bps * stat_time - mpp_data_get_pre_val_v2(p->stat_bits, -1) + cfg->bit_real) / stat_time;
    RK_S32 real_bit = cfg->bit_real;
    RK_S32 target_bit = cfg->bit_target;
    RK_S32 target_bps = p->target_bps;
    RK_S32 water_level = 0;
    RK_S32 idx1, idx2;
    RK_S32 bit_diff_ratio, ins_ratio, bps_ratio, wl_ratio;
    RK_S32 mb_w = MPP_ALIGN(usr_cfg->width, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(usr_cfg->height, 16) / 16;

    rc_dbg_func("enter %p\n", p);

    if (p->cur_super_thd <= cfg->bit_real &&
        usr_cfg->super_cfg.rc_priority == MPP_ENC_RC_BY_FRM_SIZE_FIRST) {
        return reenc_calc_super_frm_ratio(ctx, cfg);
    }

    if (real_bit + p->stat_watl > p->watl_thrd)
        water_level = p->watl_thrd - p->bit_per_frame;
    else
        water_level = real_bit + p->stat_watl - p->bit_per_frame;

    if (water_level < 0) {
        water_level = 0;
    }

    if (target_bit > real_bit)
        bit_diff_ratio = 32 * (real_bit - target_bit) / real_bit;
    else
        bit_diff_ratio = 32 * (real_bit - target_bit) / target_bit;

    idx1 = ins_bps / (target_bps >> 5);
    idx2 = pre_ins_bps / (target_bps >> 5);

    idx1 = mpp_clip(idx1, 0, 63);
    idx2 = mpp_clip(idx2, 0, 63);
    ins_ratio = tab_lnx[idx1] - tab_lnx[idx2];

    bps_ratio = 96 * (ins_bps - target_bps) / target_bps;
    wl_ratio = 32 * (water_level - p->watl_base) /  p->watl_base;
    if (pre_ins_bps < ins_bps && target_bps != pre_ins_bps) {
        ins_ratio = 6 * ins_ratio;
        ins_ratio = mpp_clip(ins_ratio, -192, 256);
    } else {
        if (cfg->frame_type == INTRA_FRAME) {
            ins_ratio = 3 * ins_ratio;
            ins_ratio = mpp_clip(ins_ratio, -192, 256);
        } else {
            ins_ratio = 0;
        }
    }

    bit_diff_ratio = mpp_clip(bit_diff_ratio, -128, 256);
    bps_ratio = mpp_clip(bps_ratio, -32, 32);
    wl_ratio  = mpp_clip(wl_ratio, -32, 32);
    p->next_ratio = bit_diff_ratio + ins_ratio + bps_ratio + wl_ratio;
    if (cfg->frame_type  == INTRA_FRAME && (cfg->madi > 0)) {
        RK_U32 tar_bpp = target_bit / (mb_w * mb_h);
        float lnb_t = log(tar_bpp);
        float c = 6.7204, a = -0.1435, b = 0.0438;
        float start_qp = (p->cur_scale_qp >> 6);
        int qp_c = ((lnb_t - cfg->madi * b - c) / a + 14);
        if (qp_c > start_qp)
            p->next_ratio  = (qp_c << 6) - p->cur_scale_qp;
    }
    rc_dbg_rc("cbr target_bit %d real_bit %d reenc next ratio %d", target_bit, real_bit, p->next_ratio);
    rc_dbg_func("leave %p\n", p);
    return MPP_OK;
}